

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O3

void __thiscall
icu_63::CollationIterator::CollationIterator(CollationIterator *this,CollationIterator *other)

{
  int appCap;
  long *plVar1;
  long *plVar2;
  CollationData *pCVar3;
  UBool UVar4;
  int32_t i;
  long lVar5;
  UErrorCode errorCode;
  UErrorCode local_2c;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__CollationIterator_003b2928;
  pCVar3 = other->data;
  this->trie = other->trie;
  this->data = pCVar3;
  (this->ceBuffer).length = 0;
  (this->ceBuffer).buffer.ptr = (this->ceBuffer).buffer.stackArray;
  (this->ceBuffer).buffer.capacity = 0x28;
  (this->ceBuffer).buffer.needToRelease = '\0';
  this->cesIndex = other->cesIndex;
  this->skipped = (SkippedState *)0x0;
  this->numCpFwd = other->numCpFwd;
  this->isNumeric = other->isNumeric;
  local_2c = U_ZERO_ERROR;
  appCap = (other->ceBuffer).length;
  if (0 < (long)appCap) {
    UVar4 = CEBuffer::ensureAppendCapacity(&this->ceBuffer,appCap,&local_2c);
    if (UVar4 != '\0') {
      plVar1 = (other->ceBuffer).buffer.ptr;
      plVar2 = (this->ceBuffer).buffer.ptr;
      lVar5 = 0;
      do {
        plVar2[lVar5] = plVar1[lVar5];
        lVar5 = lVar5 + 1;
      } while (appCap != lVar5);
      (this->ceBuffer).length = appCap;
      return;
    }
  }
  this->cesIndex = 0;
  return;
}

Assistant:

CollationIterator::CollationIterator(const CollationIterator &other)
        : UObject(other),
          trie(other.trie),
          data(other.data),
          cesIndex(other.cesIndex),
          skipped(NULL),
          numCpFwd(other.numCpFwd),
          isNumeric(other.isNumeric) {
    UErrorCode errorCode = U_ZERO_ERROR;
    int32_t length = other.ceBuffer.length;
    if(length > 0 && ceBuffer.ensureAppendCapacity(length, errorCode)) {
        for(int32_t i = 0; i < length; ++i) {
            ceBuffer.set(i, other.ceBuffer.get(i));
        }
        ceBuffer.length = length;
    } else {
        cesIndex = 0;
    }
}